

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.cpp
# Opt level: O2

void __thiscall Paragraph::print(Paragraph *this)

{
  pointer ppPVar1;
  
  puts((this->super_Section)._text);
  for (ppPVar1 = (this->_sections).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppPVar1 !=
      (this->_sections).super__Vector_base<Paragraph_*,_std::allocator<Paragraph_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppPVar1 = ppPVar1 + 1) {
    if (*ppPVar1 != (Paragraph *)0x0) {
      (*((*ppPVar1)->super_Section)._vptr_Section[2])();
    }
  }
  return;
}

Assistant:

void Paragraph::print()
{
	printf("%s\n", _text);

	vector<Paragraph*>::iterator iter = _sections.begin();
	for (; iter != _sections.end(); ++iter) {
		if (*iter)
			(*iter)->print();
	}
}